

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::DenseVector::_internal_add_values(DenseVector *this,double value)

{
  RepeatedField<double> *this_00;
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double tmp;
  
  this_00 = &this->values_;
  uVar1 = (this->values_).current_size_;
  uVar2 = (this->values_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<double>::Reserve(this_00,uVar2 + 1);
  }
  pdVar3 = google::protobuf::RepeatedField<double>::elements(this_00);
  pdVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void DenseVector::_internal_add_values(double value) {
  values_.Add(value);
}